

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revision_opt.cpp
# Opt level: O0

revision_opt * __thiscall
pstore::command_line::revision_opt::operator=(revision_opt *this,string *val)

{
  bool bVar1;
  ulong uVar2;
  uint *puVar3;
  maybe<unsigned_int,_void> local_20;
  maybe<unsigned_int,_void> rp;
  string *val_local;
  revision_opt *this_local;
  
  rp = (maybe<unsigned_int,_void>)val;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    str_to_revision(&local_20,(string *)rp);
    bVar1 = maybe::operator_cast_to_bool((maybe *)&local_20);
    if (!bVar1) {
      std::operator<<((ostream *)&std::cerr,
                      "Error: revision must be a revision number or \'HEAD\'\n");
      exit(1);
    }
    puVar3 = maybe<unsigned_int,_void>::operator*(&local_20);
    this->r_ = *puVar3;
    maybe<unsigned_int,_void>::~maybe(&local_20);
  }
  return this;
}

Assistant:

revision_opt & revision_opt::operator= (std::string const & val) {
            if (!val.empty ()) {
                auto rp = pstore::str_to_revision (val);
                if (!rp) {
                    error_stream << PSTORE_NATIVE_TEXT (
                        "Error: revision must be a revision number or 'HEAD'\n");
                    std::exit (EXIT_FAILURE);
                }
                r_ = *rp;
            }
            return *this;
        }